

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void __thiscall QGuiApplicationPrivate::~QGuiApplicationPrivate(QGuiApplicationPrivate *this)

{
  qsizetype qVar1;
  const_reference ppQVar2;
  QOpenGLContext *pQVar3;
  QCoreApplicationPrivate *in_RDI;
  QList<QObject_*> *ctx;
  int i;
  qsizetype in_stack_ffffffffffffffa8;
  QList<QObject_*> *in_stack_ffffffffffffffb0;
  QList<QWindow_*> *this_00;
  int local_c;
  
  *(undefined ***)in_RDI = &PTR__QGuiApplicationPrivate_00e16650;
  QCoreApplicationPrivate::is_app_closing._0_1_ = 1;
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  local_c = 0;
  while( true ) {
    qVar1 = QList<QObject_*>::size(&generic_plugin_list);
    if (qVar1 <= local_c) break;
    ppQVar2 = QList<QObject_*>::at(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (*ppQVar2 != (QObject *)0x0) {
      (**(code **)(*(long *)*ppQVar2 + 0x20))();
    }
    local_c = local_c + 1;
  }
  ctx = &generic_plugin_list;
  QList<QObject_*>::clear(in_stack_ffffffffffffffb0);
  clearFontUnlocked();
  QFont::cleanup((EVP_PKEY_CTX *)ctx);
  QCursorData::cleanup((EVP_PKEY_CTX *)ctx);
  layout_direction = LayoutDirectionAuto;
  QCoreApplicationPrivate::cleanupThreadData();
  if (styleHints != (QStyleHints *)0x0) {
    (**(code **)(*(long *)styleHints + 0x20))();
  }
  styleHints = (QStyleHints *)0x0;
  if (*(long **)(in_RDI + 0x118) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x118) + 0x20))();
  }
  qt_cleanupFontDatabase();
  QPixmapCache::clear();
  if (((byte)in_RDI[0x170] & 1) != 0) {
    pQVar3 = qt_gl_global_share_context();
    if (pQVar3 != (QOpenGLContext *)0x0) {
      (**(code **)(*(long *)pQVar3 + 0x20))();
    }
    qt_gl_set_global_share_context((QOpenGLContext *)0x0);
  }
  (*platform_integration->_vptr_QPlatformIntegration[0xc])();
  if (platform_theme != (QPlatformTheme *)0x0) {
    (*platform_theme->_vptr_QPlatformTheme[1])();
  }
  platform_theme = (QPlatformTheme *)0x0;
  this_00 = (QList<QWindow_*> *)platform_integration;
  if (platform_integration != (QPlatformIntegration *)0x0) {
    (*platform_integration->_vptr_QPlatformIntegration[1])();
    this_00 = (QList<QWindow_*> *)platform_integration;
  }
  platform_integration = (QPlatformIntegration *)0x0;
  QList<QWindow_*>::clear(this_00);
  QList<QWindow_*>::clear(this_00);
  QList<QScreen_*>::clear((QList<QScreen_*> *)this_00);
  self = (QGuiApplicationPrivate *)0x0;
  std::shared_ptr<QColorTrcLut>::~shared_ptr((shared_ptr<QColorTrcLut> *)0x3646c7);
  QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::~QHash
            ((QHash<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *)this_00);
  QShortcutMap::~QShortcutMap((QShortcutMap *)0x3646e9);
  QIcon::~QIcon((QIcon *)this_00);
  QString::~QString((QString *)0x36470b);
  QList<QCursor>::~QList((QList<QCursor> *)0x36471c);
  QList<QWindow_*>::~QList((QList<QWindow_*> *)0x36472d);
  QCoreApplicationPrivate::~QCoreApplicationPrivate(in_RDI);
  return;
}

Assistant:

QGuiApplicationPrivate::~QGuiApplicationPrivate()
{
    is_app_closing = true;
    is_app_running = false;

    for (int i = 0; i < generic_plugin_list.size(); ++i)
        delete generic_plugin_list.at(i);
    generic_plugin_list.clear();

    clearFontUnlocked();

    QFont::cleanup();

#ifndef QT_NO_CURSOR
    QCursorData::cleanup();
#endif

    layout_direction = Qt::LayoutDirectionAuto;

    cleanupThreadData();

    delete QGuiApplicationPrivate::styleHints;
    QGuiApplicationPrivate::styleHints = nullptr;
    delete inputMethod;

    qt_cleanupFontDatabase();

    QPixmapCache::clear();

#ifndef QT_NO_OPENGL
    if (ownGlobalShareContext) {
        delete qt_gl_global_share_context();
        qt_gl_set_global_share_context(nullptr);
    }
#endif

#if QT_CONFIG(vulkan)
    QVulkanDefaultInstance::cleanup();
#endif

    platform_integration->destroy();

    delete platform_theme;
    platform_theme = nullptr;
    delete platform_integration;
    platform_integration = nullptr;

    window_list.clear();
    popup_list.clear();
    screen_list.clear();

    self = nullptr;
}